

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O0

void cleanup_substitution(bsdtar *bsdtar)

{
  substitution *__ptr;
  subst_rule *__ptr_00;
  substitution *subst;
  subst_rule *rule;
  bsdtar *bsdtar_local;
  
  __ptr = bsdtar->substitution;
  if (__ptr != (substitution *)0x0) {
    while (__ptr_00 = __ptr->first_rule, __ptr_00 != (subst_rule *)0x0) {
      __ptr->first_rule = __ptr_00->next;
      free(__ptr_00->result);
      regfree((regex_t *)&__ptr_00->re);
      free(__ptr_00);
    }
    free(__ptr);
  }
  return;
}

Assistant:

void
cleanup_substitution(struct bsdtar *bsdtar)
{
	struct subst_rule *rule;
	struct substitution *subst;

	if ((subst = bsdtar->substitution) == NULL)
		return;

	while ((rule = subst->first_rule) != NULL) {
		subst->first_rule = rule->next;
		free(rule->result);
		regfree(&rule->re);
		free(rule);
	}
	free(subst);
}